

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_27b883::PeerManagerImpl::FindNextBlocks
          (PeerManagerImpl *this,
          vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_> *vBlocks,Peer *peer,
          CNodeState *state,CBlockIndex *pindexWalk,uint count,int nWindowEnd,CChain *activeChain,
          NodeId *nodeStaller)

{
  int iVar1;
  CBlockIndex *pCVar2;
  pointer ppCVar3;
  uint256 *puVar4;
  _Base_ptr p_Var5;
  iterator __position;
  pointer ppCVar6;
  byte bVar7;
  int iVar8;
  uint uVar9;
  CBlockIndex *pCVar10;
  long lVar11;
  CBlockIndex *pCVar12;
  size_type sVar13;
  pointer ppCVar14;
  pointer ppCVar15;
  int *piVar16;
  int iVar17;
  _Base_ptr p_Var18;
  long in_FS_OFFSET;
  CBlockIndex *pindex;
  vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_> vToFetch;
  long local_d0;
  CBlockIndex *local_80;
  vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_> local_78;
  key_type local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = state->pindexBestKnownBlock->nHeight;
  if (nWindowEnd + 1 < iVar1) {
    iVar1 = nWindowEnd + 1;
  }
  if (((peer->m_their_services)._M_i & NODE_NETWORK) == NODE_NONE) {
    bVar7 = (byte)((peer->m_their_services)._M_i >> 10) & 1;
  }
  else {
    bVar7 = 0;
  }
  iVar8 = pindexWalk->nHeight;
  if (iVar8 < iVar1) {
    piVar16 = &pindexWalk->nHeight;
    local_d0 = -1;
    do {
      iVar17 = count - (int)((ulong)((long)(vBlocks->
                                           super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(vBlocks->
                                          super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>
                                          )._M_impl.super__Vector_impl_data._M_start) >> 3);
      if (iVar17 < 0x81) {
        iVar17 = 0x80;
      }
      if (iVar1 - iVar8 <= iVar17) {
        iVar17 = iVar1 - iVar8;
      }
      std::vector<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>::resize
                (&local_78,(long)iVar17);
      pCVar10 = CBlockIndex::GetAncestor(state->pindexBestKnownBlock,*piVar16 + iVar17);
      ppCVar6 = local_78.
                super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      local_78.super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>._M_impl
      .super__Vector_impl_data._M_start[(long)iVar17 - 1] = pCVar10;
      ppCVar15 = local_78.
                 super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if (iVar17 - 1U != 0) {
        lVar11 = (ulong)(iVar17 - 1U) << 3;
        do {
          *(undefined8 *)
           ((long)local_78.
                  super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>.
                  _M_impl.super__Vector_impl_data._M_start + lVar11 + -8) =
               *(undefined8 *)
                (*(long *)((long)local_78.
                                 super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar11) + 8);
          lVar11 = lVar11 + -8;
        } while (lVar11 != 0);
      }
      for (; ppCVar15 != ppCVar6; ppCVar15 = ppCVar15 + 1) {
        pCVar2 = *ppCVar15;
        local_80 = pCVar2;
        if ((((pCVar2->nStatus & 0x60) != 0) || ((pCVar2->nStatus & 6) == 0)) ||
           ((((peer->m_their_services)._M_i & NODE_WITNESS) == NODE_NONE &&
            ((((this->m_chainman->m_options).chainparams)->consensus).SegwitHeight <=
             pCVar2->nHeight)))) goto LAB_001ee510;
        if ((pCVar2->nStatus & 8) == 0) {
          if (activeChain != (CChain *)0x0) {
            iVar8 = pCVar2->nHeight;
            if (((long)iVar8 < 0) ||
               (ppCVar3 = (activeChain->vChain).
                          super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                          super__Vector_impl_data._M_start,
               (int)((ulong)((long)(activeChain->vChain).
                                   super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar3) >> 3)
               <= iVar8)) {
              pCVar12 = (CBlockIndex *)0x0;
            }
            else {
              pCVar12 = ppCVar3[iVar8];
            }
            if (pCVar12 == pCVar2) goto LAB_001ee422;
          }
          puVar4 = pCVar2->phashBlock;
          if (puVar4 == (uint256 *)0x0) {
            __assert_fail("phashBlock != nullptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h"
                          ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
          }
          local_58.super_base_blob<256U>.m_data._M_elems._0_8_ =
               *(undefined8 *)(puVar4->super_base_blob<256U>).m_data._M_elems;
          local_58.super_base_blob<256U>.m_data._M_elems._8_8_ =
               *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 8);
          local_58.super_base_blob<256U>.m_data._M_elems._16_8_ =
               *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x10);
          local_58.super_base_blob<256U>.m_data._M_elems._24_8_ =
               *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x18);
          sVar13 = std::
                   multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
                   ::count(&this->mapBlocksInFlight,&local_58);
          if (sVar13 == 0) {
            if (nWindowEnd < pCVar2->nHeight) {
              if ((((vBlocks->
                    super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>).
                    _M_impl.super__Vector_impl_data._M_finish ==
                    (vBlocks->
                    super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>).
                    _M_impl.super__Vector_impl_data._M_start) && (nodeStaller != (NodeId *)0x0)) &&
                 (local_d0 != peer->m_id)) {
                *nodeStaller = local_d0;
              }
              goto LAB_001ee510;
            }
            if ((bVar7 == 0) || (state->pindexBestKnownBlock->nHeight - pCVar2->nHeight < 0x11e)) {
              __position._M_current =
                   (vBlocks->
                   super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (vBlocks->
                  super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>).
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<CBlockIndex_const*,std::allocator<CBlockIndex_const*>>::
                _M_realloc_insert<CBlockIndex_const*const&>
                          ((vector<CBlockIndex_const*,std::allocator<CBlockIndex_const*>> *)vBlocks,
                           __position,&local_80);
                ppCVar14 = (vBlocks->
                           super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
              }
              else {
                *__position._M_current = pCVar2;
                ppCVar14 = (vBlocks->
                           super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>
                           )._M_impl.super__Vector_impl_data._M_finish + 1;
                (vBlocks->
                super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>).
                _M_impl.super__Vector_impl_data._M_finish = ppCVar14;
              }
              if ((long)ppCVar14 -
                  (long)(vBlocks->
                        super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 3 == (ulong)count)
              goto LAB_001ee510;
            }
          }
          else if (local_d0 == -1) {
            local_58.super_base_blob<256U>.m_data._M_elems._0_8_ =
                 *(undefined8 *)(puVar4->super_base_blob<256U>).m_data._M_elems;
            local_58.super_base_blob<256U>.m_data._M_elems._8_8_ =
                 *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 8);
            local_58.super_base_blob<256U>.m_data._M_elems._16_8_ =
                 *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x10);
            local_58.super_base_blob<256U>.m_data._M_elems._24_8_ =
                 *(undefined8 *)((puVar4->super_base_blob<256U>).m_data._M_elems + 0x18);
            p_Var5 = (this->mapBlocksInFlight)._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_parent;
            p_Var18 = &(this->mapBlocksInFlight)._M_t._M_impl.super__Rb_tree_header._M_header;
            for (; (_Rb_tree_header *)p_Var5 != (_Rb_tree_header *)0x0;
                p_Var5 = (&p_Var5->_M_left)[uVar9 >> 0x1f]) {
              uVar9 = memcmp(p_Var5 + 1,&local_58,0x20);
              if (-1 < (int)uVar9) {
                p_Var18 = p_Var5;
              }
            }
            local_d0 = *(long *)(p_Var18 + 2);
          }
        }
        else if (activeChain != (CChain *)0x0) {
LAB_001ee422:
          if (pCVar2->m_chain_tx_count != 0) {
            state->pindexLastCommonBlock = pCVar2;
          }
        }
      }
      piVar16 = &pCVar10->nHeight;
      iVar8 = pCVar10->nHeight;
    } while (iVar8 < iVar1);
  }
LAB_001ee510:
  if (local_78.super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<const_CBlockIndex_*,_std::allocator<const_CBlockIndex_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::FindNextBlocks(std::vector<const CBlockIndex*>& vBlocks, const Peer& peer, CNodeState *state, const CBlockIndex *pindexWalk, unsigned int count, int nWindowEnd, const CChain* activeChain, NodeId* nodeStaller)
{
    std::vector<const CBlockIndex*> vToFetch;
    int nMaxHeight = std::min<int>(state->pindexBestKnownBlock->nHeight, nWindowEnd + 1);
    bool is_limited_peer = IsLimitedPeer(peer);
    NodeId waitingfor = -1;
    while (pindexWalk->nHeight < nMaxHeight) {
        // Read up to 128 (or more, if more blocks than that are needed) successors of pindexWalk (towards
        // pindexBestKnownBlock) into vToFetch. We fetch 128, because CBlockIndex::GetAncestor may be as expensive
        // as iterating over ~100 CBlockIndex* entries anyway.
        int nToFetch = std::min(nMaxHeight - pindexWalk->nHeight, std::max<int>(count - vBlocks.size(), 128));
        vToFetch.resize(nToFetch);
        pindexWalk = state->pindexBestKnownBlock->GetAncestor(pindexWalk->nHeight + nToFetch);
        vToFetch[nToFetch - 1] = pindexWalk;
        for (unsigned int i = nToFetch - 1; i > 0; i--) {
            vToFetch[i - 1] = vToFetch[i]->pprev;
        }

        // Iterate over those blocks in vToFetch (in forward direction), adding the ones that
        // are not yet downloaded and not in flight to vBlocks. In the meantime, update
        // pindexLastCommonBlock as long as all ancestors are already downloaded, or if it's
        // already part of our chain (and therefore don't need it even if pruned).
        for (const CBlockIndex* pindex : vToFetch) {
            if (!pindex->IsValid(BLOCK_VALID_TREE)) {
                // We consider the chain that this peer is on invalid.
                return;
            }

            if (!CanServeWitnesses(peer) && DeploymentActiveAt(*pindex, m_chainman, Consensus::DEPLOYMENT_SEGWIT)) {
                // We wouldn't download this block or its descendants from this peer.
                return;
            }

            if (pindex->nStatus & BLOCK_HAVE_DATA || (activeChain && activeChain->Contains(pindex))) {
                if (activeChain && pindex->HaveNumChainTxs()) {
                    state->pindexLastCommonBlock = pindex;
                }
                continue;
            }

            // Is block in-flight?
            if (IsBlockRequested(pindex->GetBlockHash())) {
                if (waitingfor == -1) {
                    // This is the first already-in-flight block.
                    waitingfor = mapBlocksInFlight.lower_bound(pindex->GetBlockHash())->second.first;
                }
                continue;
            }

            // The block is not already downloaded, and not yet in flight.
            if (pindex->nHeight > nWindowEnd) {
                // We reached the end of the window.
                if (vBlocks.size() == 0 && waitingfor != peer.m_id) {
                    // We aren't able to fetch anything, but we would be if the download window was one larger.
                    if (nodeStaller) *nodeStaller = waitingfor;
                }
                return;
            }

            // Don't request blocks that go further than what limited peers can provide
            if (is_limited_peer && (state->pindexBestKnownBlock->nHeight - pindex->nHeight >= static_cast<int>(NODE_NETWORK_LIMITED_MIN_BLOCKS) - 2 /* two blocks buffer for possible races */)) {
                continue;
            }

            vBlocks.push_back(pindex);
            if (vBlocks.size() == count) {
                return;
            }
        }
    }
}